

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckFormControls(TidyDocImpl *doc,Node *node)

{
  if (((doc->access).HasValidFor == no) && ((doc->access).HasValidId != no)) {
    prvTidyReportAccessError(doc,node,0x303);
  }
  if ((doc->access).HasValidId != no) {
    return;
  }
  if ((doc->access).HasValidFor != no) {
    prvTidyReportAccessError(doc,node,0x304);
    if ((doc->access).HasValidId != no) {
      return;
    }
    if ((doc->access).HasValidFor != no) {
      return;
    }
  }
  prvTidyReportAccessError(doc,node,0x302);
  return;
}

Assistant:

static void CheckFormControls( TidyDocImpl* doc, Node* node )
{
    if ( !doc->access.HasValidFor &&
         doc->access.HasValidId )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY_FOR);
    }    

    if ( !doc->access.HasValidId &&
         doc->access.HasValidFor )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY_ID);
    }

    if ( !doc->access.HasValidId &&
         !doc->access.HasValidFor )
    {
        TY_(ReportAccessError)( doc, node, ASSOCIATE_LABELS_EXPLICITLY);
    }
}